

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O3

size_t bitset_union_count(bitset_t *b1,bitset_t *b2)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char cVar8;
  ushort uVar9;
  byte bVar33;
  undefined1 auVar15 [12];
  undefined1 auVar18 [12];
  char cVar34;
  byte bVar35;
  char cVar36;
  byte bVar37;
  char cVar38;
  byte bVar39;
  char cVar40;
  byte bVar41;
  undefined1 auVar25 [16];
  undefined1 auVar28 [16];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar31 [16];
  char cVar42;
  undefined1 auVar47 [12];
  byte bVar75;
  char cVar76;
  byte bVar77;
  char cVar78;
  byte bVar79;
  char cVar80;
  byte bVar81;
  char cVar82;
  byte bVar83;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar49 [12];
  undefined1 auVar66 [16];
  undefined1 auVar50 [12];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar51 [12];
  undefined1 auVar71 [16];
  undefined1 auVar52 [12];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined4 uVar10;
  undefined6 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  ushort uVar43;
  undefined4 uVar44;
  undefined6 uVar45;
  undefined8 uVar46;
  undefined1 auVar48 [12];
  undefined1 auVar53 [14];
  undefined1 auVar54 [14];
  undefined1 auVar55 [14];
  undefined1 auVar56 [14];
  undefined1 auVar57 [14];
  undefined1 auVar58 [14];
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  
  uVar5 = b1->arraysize;
  uVar6 = b2->arraysize;
  uVar4 = uVar6;
  if (uVar5 < uVar6) {
    uVar4 = uVar5;
  }
  if (uVar4 < 4) {
    sVar1 = 0;
    uVar3 = 0;
  }
  else {
    sVar1 = 0;
    uVar7 = 0;
    do {
      auVar25 = *(undefined1 (*) [16])(b2->array + uVar7) |
                *(undefined1 (*) [16])(b1->array + uVar7);
      auVar59 = *(undefined1 (*) [16])(b2->array + uVar7 + 2) |
                *(undefined1 (*) [16])(b1->array + uVar7 + 2);
      auVar84._0_2_ = auVar59._0_2_ >> 1;
      auVar84._2_2_ = auVar59._2_2_ >> 1;
      auVar84._4_2_ = auVar59._4_2_ >> 1;
      auVar84._6_2_ = auVar59._6_2_ >> 1;
      auVar84._8_2_ = auVar59._8_2_ >> 1;
      auVar84._10_2_ = auVar59._10_2_ >> 1;
      auVar84._12_2_ = auVar59._12_2_ >> 1;
      auVar84._14_2_ = auVar59._14_2_ >> 1;
      auVar84 = auVar84 & _DAT_001311c0;
      uVar9 = CONCAT11(auVar59[1] - auVar84[1],auVar59[0] - auVar84[0]);
      uVar10 = CONCAT13(auVar59[3] - auVar84[3],CONCAT12(auVar59[2] - auVar84[2],uVar9));
      uVar11 = CONCAT15(auVar59[5] - auVar84[5],CONCAT14(auVar59[4] - auVar84[4],uVar10));
      uVar12 = CONCAT17(auVar59[7] - auVar84[7],CONCAT16(auVar59[6] - auVar84[6],uVar11));
      auVar47._0_10_ = CONCAT19(auVar59[9] - auVar84[9],CONCAT18(auVar59[8] - auVar84[8],uVar12));
      auVar47[10] = auVar59[10] - auVar84[10];
      auVar47[0xb] = auVar59[0xb] - auVar84[0xb];
      auVar53[0xc] = auVar59[0xc] - auVar84[0xc];
      auVar53._0_12_ = auVar47;
      auVar53[0xd] = auVar59[0xd] - auVar84[0xd];
      auVar63[0xe] = auVar59[0xe] - auVar84[0xe];
      auVar63._0_14_ = auVar53;
      auVar63[0xf] = auVar59[0xf] - auVar84[0xf];
      auVar59 = auVar63 & _DAT_001311d0;
      auVar60._0_2_ = uVar9 >> 2;
      auVar60._2_2_ = (ushort)((uint)uVar10 >> 0x12);
      auVar60._4_2_ = (ushort)((uint6)uVar11 >> 0x22);
      auVar60._6_2_ = (ushort)((ulong)uVar12 >> 0x32);
      auVar60._8_2_ = (ushort)((unkuint10)auVar47._0_10_ >> 0x42);
      auVar60._10_2_ = auVar47._10_2_ >> 2;
      auVar60._12_2_ = auVar53._12_2_ >> 2;
      auVar60._14_2_ = auVar63._14_2_ >> 2;
      auVar60 = auVar60 & _DAT_001311d0;
      cVar42 = auVar60[0] + auVar59[0];
      bVar75 = auVar60[1] + auVar59[1];
      uVar43 = CONCAT11(bVar75,cVar42);
      cVar76 = auVar60[2] + auVar59[2];
      bVar77 = auVar60[3] + auVar59[3];
      uVar44 = CONCAT13(bVar77,CONCAT12(cVar76,uVar43));
      cVar78 = auVar60[4] + auVar59[4];
      bVar79 = auVar60[5] + auVar59[5];
      uVar45 = CONCAT15(bVar79,CONCAT14(cVar78,uVar44));
      cVar80 = auVar60[6] + auVar59[6];
      bVar81 = auVar60[7] + auVar59[7];
      uVar46 = CONCAT17(bVar81,CONCAT16(cVar80,uVar45));
      cVar82 = auVar60[8] + auVar59[8];
      bVar83 = auVar60[9] + auVar59[9];
      auVar48._0_10_ = CONCAT19(bVar83,CONCAT18(cVar82,uVar46));
      auVar48[10] = auVar60[10] + auVar59[10];
      auVar48[0xb] = auVar60[0xb] + auVar59[0xb];
      auVar54[0xc] = auVar60[0xc] + auVar59[0xc];
      auVar54._0_12_ = auVar48;
      auVar54[0xd] = auVar60[0xd] + auVar59[0xd];
      auVar61[0xe] = auVar60[0xe] + auVar59[0xe];
      auVar61._0_14_ = auVar54;
      auVar61[0xf] = auVar60[0xf] + auVar59[0xf];
      auVar62._0_2_ = auVar25._0_2_ >> 1;
      auVar62._2_2_ = auVar25._2_2_ >> 1;
      auVar62._4_2_ = auVar25._4_2_ >> 1;
      auVar62._6_2_ = auVar25._6_2_ >> 1;
      auVar62._8_2_ = auVar25._8_2_ >> 1;
      auVar62._10_2_ = auVar25._10_2_ >> 1;
      auVar62._12_2_ = auVar25._12_2_ >> 1;
      auVar62._14_2_ = auVar25._14_2_ >> 1;
      auVar62 = auVar62 & _DAT_001311c0;
      uVar9 = CONCAT11(auVar25[1] - auVar62[1],auVar25[0] - auVar62[0]);
      uVar10 = CONCAT13(auVar25[3] - auVar62[3],CONCAT12(auVar25[2] - auVar62[2],uVar9));
      uVar11 = CONCAT15(auVar25[5] - auVar62[5],CONCAT14(auVar25[4] - auVar62[4],uVar10));
      uVar12 = CONCAT17(auVar25[7] - auVar62[7],CONCAT16(auVar25[6] - auVar62[6],uVar11));
      auVar13._0_10_ = CONCAT19(auVar25[9] - auVar62[9],CONCAT18(auVar25[8] - auVar62[8],uVar12));
      auVar13[10] = auVar25[10] - auVar62[10];
      auVar13[0xb] = auVar25[0xb] - auVar62[0xb];
      auVar19[0xc] = auVar25[0xc] - auVar62[0xc];
      auVar19._0_12_ = auVar13;
      auVar19[0xd] = auVar25[0xd] - auVar62[0xd];
      auVar59[0xe] = auVar25[0xe] - auVar62[0xe];
      auVar59._0_14_ = auVar19;
      auVar59[0xf] = auVar25[0xf] - auVar62[0xf];
      auVar63 = auVar59 & _DAT_001311d0;
      auVar25._0_2_ = uVar9 >> 2;
      auVar25._2_2_ = (ushort)((uint)uVar10 >> 0x12);
      auVar25._4_2_ = (ushort)((uint6)uVar11 >> 0x22);
      auVar25._6_2_ = (ushort)((ulong)uVar12 >> 0x32);
      auVar25._8_2_ = (ushort)((unkuint10)auVar13._0_10_ >> 0x42);
      auVar25._10_2_ = auVar13._10_2_ >> 2;
      auVar25._12_2_ = auVar19._12_2_ >> 2;
      auVar25._14_2_ = auVar59._14_2_ >> 2;
      auVar25 = auVar25 & _DAT_001311d0;
      cVar8 = auVar25[0] + auVar63[0];
      bVar33 = auVar25[1] + auVar63[1];
      uVar9 = CONCAT11(bVar33,cVar8);
      cVar34 = auVar25[2] + auVar63[2];
      bVar35 = auVar25[3] + auVar63[3];
      uVar10 = CONCAT13(bVar35,CONCAT12(cVar34,uVar9));
      cVar36 = auVar25[4] + auVar63[4];
      bVar37 = auVar25[5] + auVar63[5];
      uVar11 = CONCAT15(bVar37,CONCAT14(cVar36,uVar10));
      cVar38 = auVar25[6] + auVar63[6];
      bVar39 = auVar25[7] + auVar63[7];
      uVar12 = CONCAT17(bVar39,CONCAT16(cVar38,uVar11));
      cVar40 = auVar25[8] + auVar63[8];
      bVar41 = auVar25[9] + auVar63[9];
      auVar14._0_10_ = CONCAT19(bVar41,CONCAT18(cVar40,uVar12));
      auVar14[10] = auVar25[10] + auVar63[10];
      auVar14[0xb] = auVar25[0xb] + auVar63[0xb];
      auVar20[0xc] = auVar25[0xc] + auVar63[0xc];
      auVar20._0_12_ = auVar14;
      auVar20[0xd] = auVar25[0xd] + auVar63[0xd];
      auVar26[0xe] = auVar25[0xe] + auVar63[0xe];
      auVar26._0_14_ = auVar20;
      auVar26[0xf] = auVar25[0xf] + auVar63[0xf];
      auVar64[0] = ((char)(uVar9 >> 4) + cVar8 & 0xfU) + ((char)(uVar43 >> 4) + cVar42 & 0xfU);
      auVar64[1] = ((bVar33 >> 4) + bVar33 & 0xf) + ((bVar75 >> 4) + bVar75 & 0xf);
      auVar64[2] = ((char)(ushort)((uint)uVar10 >> 0x14) + cVar34 & 0xfU) +
                   ((char)(ushort)((uint)uVar44 >> 0x14) + cVar76 & 0xfU);
      auVar64[3] = ((bVar35 >> 4) + bVar35 & 0xf) + ((bVar77 >> 4) + bVar77 & 0xf);
      auVar64[4] = ((char)(ushort)((uint6)uVar11 >> 0x24) + cVar36 & 0xfU) +
                   ((char)(ushort)((uint6)uVar45 >> 0x24) + cVar78 & 0xfU);
      auVar64[5] = ((bVar37 >> 4) + bVar37 & 0xf) + ((bVar79 >> 4) + bVar79 & 0xf);
      auVar64[6] = ((char)(ushort)((ulong)uVar12 >> 0x34) + cVar38 & 0xfU) +
                   ((char)(ushort)((ulong)uVar46 >> 0x34) + cVar80 & 0xfU);
      auVar64[7] = ((bVar39 >> 4) + bVar39 & 0xf) + ((bVar81 >> 4) + bVar81 & 0xf);
      auVar64[8] = ((char)(ushort)((unkuint10)auVar14._0_10_ >> 0x44) + cVar40 & 0xfU) +
                   ((char)(ushort)((unkuint10)auVar48._0_10_ >> 0x44) + cVar82 & 0xfU);
      auVar64[9] = ((bVar41 >> 4) + bVar41 & 0xf) + ((bVar83 >> 4) + bVar83 & 0xf);
      auVar64[10] = ((char)(auVar14._10_2_ >> 4) + auVar14[10] & 0xfU) +
                    ((char)(auVar48._10_2_ >> 4) + auVar48[10] & 0xfU);
      auVar64[0xb] = ((auVar14[0xb] >> 4) + auVar14[0xb] & 0xf) +
                     ((auVar48[0xb] >> 4) + auVar48[0xb] & 0xf);
      auVar64[0xc] = ((char)(auVar20._12_2_ >> 4) + auVar20[0xc] & 0xfU) +
                     ((char)(auVar54._12_2_ >> 4) + auVar54[0xc] & 0xfU);
      auVar64[0xd] = ((auVar20[0xd] >> 4) + auVar20[0xd] & 0xf) +
                     ((auVar54[0xd] >> 4) + auVar54[0xd] & 0xf);
      auVar64[0xe] = ((char)(auVar26._14_2_ >> 4) + auVar26[0xe] & 0xfU) +
                     ((char)(auVar61._14_2_ >> 4) + auVar61[0xe] & 0xfU);
      auVar64[0xf] = ((auVar26[0xf] >> 4) + auVar26[0xf] & 0xf) +
                     ((auVar61[0xf] >> 4) + auVar61[0xf] & 0xf);
      auVar25 = psadbw(auVar64,(undefined1  [16])0x0);
      sVar1 = sVar1 + auVar25._8_8_ + auVar25._0_8_;
      uVar3 = uVar7 + 4;
      uVar2 = uVar7 + 7;
      uVar7 = uVar3;
    } while (uVar2 < uVar4);
  }
  uVar7 = uVar3;
  if (uVar3 < uVar4) {
    do {
      uVar7 = b2->array[uVar3] | b1->array[uVar3];
      uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
      uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
      sVar1 = sVar1 + (((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      uVar3 = uVar3 + 1;
      uVar7 = uVar4;
    } while (uVar4 != uVar3);
  }
  if (uVar5 < uVar6) {
    if (uVar7 + 3 < uVar6) {
      uVar5 = uVar7;
      do {
        auVar25 = *(undefined1 (*) [16])(b2->array + uVar5);
        auVar59 = *(undefined1 (*) [16])(b2->array + uVar5 + 2);
        auVar85._0_2_ = auVar59._0_2_ >> 1;
        auVar85._2_2_ = auVar59._2_2_ >> 1;
        auVar85._4_2_ = auVar59._4_2_ >> 1;
        auVar85._6_2_ = auVar59._6_2_ >> 1;
        auVar85._8_2_ = auVar59._8_2_ >> 1;
        auVar85._10_2_ = auVar59._10_2_ >> 1;
        auVar85._12_2_ = auVar59._12_2_ >> 1;
        auVar85._14_2_ = auVar59._14_2_ >> 1;
        auVar85 = auVar85 & _DAT_001311c0;
        uVar9 = CONCAT11(auVar59[1] - auVar85[1],auVar59[0] - auVar85[0]);
        uVar10 = CONCAT13(auVar59[3] - auVar85[3],CONCAT12(auVar59[2] - auVar85[2],uVar9));
        uVar11 = CONCAT15(auVar59[5] - auVar85[5],CONCAT14(auVar59[4] - auVar85[4],uVar10));
        uVar12 = CONCAT17(auVar59[7] - auVar85[7],CONCAT16(auVar59[6] - auVar85[6],uVar11));
        auVar49._0_10_ = CONCAT19(auVar59[9] - auVar85[9],CONCAT18(auVar59[8] - auVar85[8],uVar12));
        auVar49[10] = auVar59[10] - auVar85[10];
        auVar49[0xb] = auVar59[0xb] - auVar85[0xb];
        auVar55[0xc] = auVar59[0xc] - auVar85[0xc];
        auVar55._0_12_ = auVar49;
        auVar55[0xd] = auVar59[0xd] - auVar85[0xd];
        auVar65[0xe] = auVar59[0xe] - auVar85[0xe];
        auVar65._0_14_ = auVar55;
        auVar65[0xf] = auVar59[0xf] - auVar85[0xf];
        auVar59 = auVar65 & _DAT_001311d0;
        auVar66._0_2_ = uVar9 >> 2;
        auVar66._2_2_ = (ushort)((uint)uVar10 >> 0x12);
        auVar66._4_2_ = (ushort)((uint6)uVar11 >> 0x22);
        auVar66._6_2_ = (ushort)((ulong)uVar12 >> 0x32);
        auVar66._8_2_ = (ushort)((unkuint10)auVar49._0_10_ >> 0x42);
        auVar66._10_2_ = auVar49._10_2_ >> 2;
        auVar66._12_2_ = auVar55._12_2_ >> 2;
        auVar66._14_2_ = auVar65._14_2_ >> 2;
        auVar66 = auVar66 & _DAT_001311d0;
        cVar42 = auVar66[0] + auVar59[0];
        bVar75 = auVar66[1] + auVar59[1];
        uVar43 = CONCAT11(bVar75,cVar42);
        cVar76 = auVar66[2] + auVar59[2];
        bVar77 = auVar66[3] + auVar59[3];
        uVar44 = CONCAT13(bVar77,CONCAT12(cVar76,uVar43));
        cVar78 = auVar66[4] + auVar59[4];
        bVar79 = auVar66[5] + auVar59[5];
        uVar45 = CONCAT15(bVar79,CONCAT14(cVar78,uVar44));
        cVar80 = auVar66[6] + auVar59[6];
        bVar81 = auVar66[7] + auVar59[7];
        uVar46 = CONCAT17(bVar81,CONCAT16(cVar80,uVar45));
        cVar82 = auVar66[8] + auVar59[8];
        bVar83 = auVar66[9] + auVar59[9];
        auVar50._0_10_ = CONCAT19(bVar83,CONCAT18(cVar82,uVar46));
        auVar50[10] = auVar66[10] + auVar59[10];
        auVar50[0xb] = auVar66[0xb] + auVar59[0xb];
        auVar56[0xc] = auVar66[0xc] + auVar59[0xc];
        auVar56._0_12_ = auVar50;
        auVar56[0xd] = auVar66[0xd] + auVar59[0xd];
        auVar67[0xe] = auVar66[0xe] + auVar59[0xe];
        auVar67._0_14_ = auVar56;
        auVar67[0xf] = auVar66[0xf] + auVar59[0xf];
        auVar68._0_2_ = auVar25._0_2_ >> 1;
        auVar68._2_2_ = auVar25._2_2_ >> 1;
        auVar68._4_2_ = auVar25._4_2_ >> 1;
        auVar68._6_2_ = auVar25._6_2_ >> 1;
        auVar68._8_2_ = auVar25._8_2_ >> 1;
        auVar68._10_2_ = auVar25._10_2_ >> 1;
        auVar68._12_2_ = auVar25._12_2_ >> 1;
        auVar68._14_2_ = auVar25._14_2_ >> 1;
        auVar68 = auVar68 & _DAT_001311c0;
        uVar9 = CONCAT11(auVar25[1] - auVar68[1],auVar25[0] - auVar68[0]);
        uVar10 = CONCAT13(auVar25[3] - auVar68[3],CONCAT12(auVar25[2] - auVar68[2],uVar9));
        uVar11 = CONCAT15(auVar25[5] - auVar68[5],CONCAT14(auVar25[4] - auVar68[4],uVar10));
        uVar12 = CONCAT17(auVar25[7] - auVar68[7],CONCAT16(auVar25[6] - auVar68[6],uVar11));
        auVar15._0_10_ = CONCAT19(auVar25[9] - auVar68[9],CONCAT18(auVar25[8] - auVar68[8],uVar12));
        auVar15[10] = auVar25[10] - auVar68[10];
        auVar15[0xb] = auVar25[0xb] - auVar68[0xb];
        auVar21[0xc] = auVar25[0xc] - auVar68[0xc];
        auVar21._0_12_ = auVar15;
        auVar21[0xd] = auVar25[0xd] - auVar68[0xd];
        auVar27[0xe] = auVar25[0xe] - auVar68[0xe];
        auVar27._0_14_ = auVar21;
        auVar27[0xf] = auVar25[0xf] - auVar68[0xf];
        auVar25 = auVar27 & _DAT_001311d0;
        auVar28._0_2_ = uVar9 >> 2;
        auVar28._2_2_ = (ushort)((uint)uVar10 >> 0x12);
        auVar28._4_2_ = (ushort)((uint6)uVar11 >> 0x22);
        auVar28._6_2_ = (ushort)((ulong)uVar12 >> 0x32);
        auVar28._8_2_ = (ushort)((unkuint10)auVar15._0_10_ >> 0x42);
        auVar28._10_2_ = auVar15._10_2_ >> 2;
        auVar28._12_2_ = auVar21._12_2_ >> 2;
        auVar28._14_2_ = auVar27._14_2_ >> 2;
        auVar28 = auVar28 & _DAT_001311d0;
        cVar8 = auVar28[0] + auVar25[0];
        bVar33 = auVar28[1] + auVar25[1];
        uVar9 = CONCAT11(bVar33,cVar8);
        cVar34 = auVar28[2] + auVar25[2];
        bVar35 = auVar28[3] + auVar25[3];
        uVar10 = CONCAT13(bVar35,CONCAT12(cVar34,uVar9));
        cVar36 = auVar28[4] + auVar25[4];
        bVar37 = auVar28[5] + auVar25[5];
        uVar11 = CONCAT15(bVar37,CONCAT14(cVar36,uVar10));
        cVar38 = auVar28[6] + auVar25[6];
        bVar39 = auVar28[7] + auVar25[7];
        uVar12 = CONCAT17(bVar39,CONCAT16(cVar38,uVar11));
        cVar40 = auVar28[8] + auVar25[8];
        bVar41 = auVar28[9] + auVar25[9];
        auVar16._0_10_ = CONCAT19(bVar41,CONCAT18(cVar40,uVar12));
        auVar16[10] = auVar28[10] + auVar25[10];
        auVar16[0xb] = auVar28[0xb] + auVar25[0xb];
        auVar22[0xc] = auVar28[0xc] + auVar25[0xc];
        auVar22._0_12_ = auVar16;
        auVar22[0xd] = auVar28[0xd] + auVar25[0xd];
        auVar29[0xe] = auVar28[0xe] + auVar25[0xe];
        auVar29._0_14_ = auVar22;
        auVar29[0xf] = auVar28[0xf] + auVar25[0xf];
        auVar69[0] = ((char)(uVar9 >> 4) + cVar8 & 0xfU) + ((char)(uVar43 >> 4) + cVar42 & 0xfU);
        auVar69[1] = ((bVar33 >> 4) + bVar33 & 0xf) + ((bVar75 >> 4) + bVar75 & 0xf);
        auVar69[2] = ((char)(ushort)((uint)uVar10 >> 0x14) + cVar34 & 0xfU) +
                     ((char)(ushort)((uint)uVar44 >> 0x14) + cVar76 & 0xfU);
        auVar69[3] = ((bVar35 >> 4) + bVar35 & 0xf) + ((bVar77 >> 4) + bVar77 & 0xf);
        auVar69[4] = ((char)(ushort)((uint6)uVar11 >> 0x24) + cVar36 & 0xfU) +
                     ((char)(ushort)((uint6)uVar45 >> 0x24) + cVar78 & 0xfU);
        auVar69[5] = ((bVar37 >> 4) + bVar37 & 0xf) + ((bVar79 >> 4) + bVar79 & 0xf);
        auVar69[6] = ((char)(ushort)((ulong)uVar12 >> 0x34) + cVar38 & 0xfU) +
                     ((char)(ushort)((ulong)uVar46 >> 0x34) + cVar80 & 0xfU);
        auVar69[7] = ((bVar39 >> 4) + bVar39 & 0xf) + ((bVar81 >> 4) + bVar81 & 0xf);
        auVar69[8] = ((char)(ushort)((unkuint10)auVar16._0_10_ >> 0x44) + cVar40 & 0xfU) +
                     ((char)(ushort)((unkuint10)auVar50._0_10_ >> 0x44) + cVar82 & 0xfU);
        auVar69[9] = ((bVar41 >> 4) + bVar41 & 0xf) + ((bVar83 >> 4) + bVar83 & 0xf);
        auVar69[10] = ((char)(auVar16._10_2_ >> 4) + auVar16[10] & 0xfU) +
                      ((char)(auVar50._10_2_ >> 4) + auVar50[10] & 0xfU);
        auVar69[0xb] = ((auVar16[0xb] >> 4) + auVar16[0xb] & 0xf) +
                       ((auVar50[0xb] >> 4) + auVar50[0xb] & 0xf);
        auVar69[0xc] = ((char)(auVar22._12_2_ >> 4) + auVar22[0xc] & 0xfU) +
                       ((char)(auVar56._12_2_ >> 4) + auVar56[0xc] & 0xfU);
        auVar69[0xd] = ((auVar22[0xd] >> 4) + auVar22[0xd] & 0xf) +
                       ((auVar56[0xd] >> 4) + auVar56[0xd] & 0xf);
        auVar69[0xe] = ((char)(auVar29._14_2_ >> 4) + auVar29[0xe] & 0xfU) +
                       ((char)(auVar67._14_2_ >> 4) + auVar67[0xe] & 0xfU);
        auVar69[0xf] = ((auVar29[0xf] >> 4) + auVar29[0xf] & 0xf) +
                       ((auVar67[0xf] >> 4) + auVar67[0xf] & 0xf);
        auVar25 = psadbw(auVar69,(undefined1  [16])0x0);
        sVar1 = sVar1 + auVar25._8_8_ + auVar25._0_8_;
        uVar7 = uVar5 + 4;
        uVar4 = uVar5 + 7;
        uVar5 = uVar7;
      } while (uVar4 < uVar6);
    }
    if (uVar7 < uVar6) {
      do {
        uVar5 = b2->array[uVar7] - (b2->array[uVar7] >> 1 & 0x5555555555555555);
        uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
        sVar1 = sVar1 + (((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
  }
  else {
    if (uVar7 + 3 < uVar5) {
      uVar6 = uVar7;
      do {
        auVar25 = *(undefined1 (*) [16])(b1->array + uVar6);
        auVar59 = *(undefined1 (*) [16])(b1->array + uVar6 + 2);
        auVar86._0_2_ = auVar59._0_2_ >> 1;
        auVar86._2_2_ = auVar59._2_2_ >> 1;
        auVar86._4_2_ = auVar59._4_2_ >> 1;
        auVar86._6_2_ = auVar59._6_2_ >> 1;
        auVar86._8_2_ = auVar59._8_2_ >> 1;
        auVar86._10_2_ = auVar59._10_2_ >> 1;
        auVar86._12_2_ = auVar59._12_2_ >> 1;
        auVar86._14_2_ = auVar59._14_2_ >> 1;
        auVar86 = auVar86 & _DAT_001311c0;
        uVar9 = CONCAT11(auVar59[1] - auVar86[1],auVar59[0] - auVar86[0]);
        uVar10 = CONCAT13(auVar59[3] - auVar86[3],CONCAT12(auVar59[2] - auVar86[2],uVar9));
        uVar11 = CONCAT15(auVar59[5] - auVar86[5],CONCAT14(auVar59[4] - auVar86[4],uVar10));
        uVar12 = CONCAT17(auVar59[7] - auVar86[7],CONCAT16(auVar59[6] - auVar86[6],uVar11));
        auVar51._0_10_ = CONCAT19(auVar59[9] - auVar86[9],CONCAT18(auVar59[8] - auVar86[8],uVar12));
        auVar51[10] = auVar59[10] - auVar86[10];
        auVar51[0xb] = auVar59[0xb] - auVar86[0xb];
        auVar57[0xc] = auVar59[0xc] - auVar86[0xc];
        auVar57._0_12_ = auVar51;
        auVar57[0xd] = auVar59[0xd] - auVar86[0xd];
        auVar70[0xe] = auVar59[0xe] - auVar86[0xe];
        auVar70._0_14_ = auVar57;
        auVar70[0xf] = auVar59[0xf] - auVar86[0xf];
        auVar59 = auVar70 & _DAT_001311d0;
        auVar71._0_2_ = uVar9 >> 2;
        auVar71._2_2_ = (ushort)((uint)uVar10 >> 0x12);
        auVar71._4_2_ = (ushort)((uint6)uVar11 >> 0x22);
        auVar71._6_2_ = (ushort)((ulong)uVar12 >> 0x32);
        auVar71._8_2_ = (ushort)((unkuint10)auVar51._0_10_ >> 0x42);
        auVar71._10_2_ = auVar51._10_2_ >> 2;
        auVar71._12_2_ = auVar57._12_2_ >> 2;
        auVar71._14_2_ = auVar70._14_2_ >> 2;
        auVar71 = auVar71 & _DAT_001311d0;
        cVar42 = auVar71[0] + auVar59[0];
        bVar75 = auVar71[1] + auVar59[1];
        uVar43 = CONCAT11(bVar75,cVar42);
        cVar76 = auVar71[2] + auVar59[2];
        bVar77 = auVar71[3] + auVar59[3];
        uVar44 = CONCAT13(bVar77,CONCAT12(cVar76,uVar43));
        cVar78 = auVar71[4] + auVar59[4];
        bVar79 = auVar71[5] + auVar59[5];
        uVar45 = CONCAT15(bVar79,CONCAT14(cVar78,uVar44));
        cVar80 = auVar71[6] + auVar59[6];
        bVar81 = auVar71[7] + auVar59[7];
        uVar46 = CONCAT17(bVar81,CONCAT16(cVar80,uVar45));
        cVar82 = auVar71[8] + auVar59[8];
        bVar83 = auVar71[9] + auVar59[9];
        auVar52._0_10_ = CONCAT19(bVar83,CONCAT18(cVar82,uVar46));
        auVar52[10] = auVar71[10] + auVar59[10];
        auVar52[0xb] = auVar71[0xb] + auVar59[0xb];
        auVar58[0xc] = auVar71[0xc] + auVar59[0xc];
        auVar58._0_12_ = auVar52;
        auVar58[0xd] = auVar71[0xd] + auVar59[0xd];
        auVar72[0xe] = auVar71[0xe] + auVar59[0xe];
        auVar72._0_14_ = auVar58;
        auVar72[0xf] = auVar71[0xf] + auVar59[0xf];
        auVar73._0_2_ = auVar25._0_2_ >> 1;
        auVar73._2_2_ = auVar25._2_2_ >> 1;
        auVar73._4_2_ = auVar25._4_2_ >> 1;
        auVar73._6_2_ = auVar25._6_2_ >> 1;
        auVar73._8_2_ = auVar25._8_2_ >> 1;
        auVar73._10_2_ = auVar25._10_2_ >> 1;
        auVar73._12_2_ = auVar25._12_2_ >> 1;
        auVar73._14_2_ = auVar25._14_2_ >> 1;
        auVar73 = auVar73 & _DAT_001311c0;
        uVar9 = CONCAT11(auVar25[1] - auVar73[1],auVar25[0] - auVar73[0]);
        uVar10 = CONCAT13(auVar25[3] - auVar73[3],CONCAT12(auVar25[2] - auVar73[2],uVar9));
        uVar11 = CONCAT15(auVar25[5] - auVar73[5],CONCAT14(auVar25[4] - auVar73[4],uVar10));
        uVar12 = CONCAT17(auVar25[7] - auVar73[7],CONCAT16(auVar25[6] - auVar73[6],uVar11));
        auVar17._0_10_ = CONCAT19(auVar25[9] - auVar73[9],CONCAT18(auVar25[8] - auVar73[8],uVar12));
        auVar17[10] = auVar25[10] - auVar73[10];
        auVar17[0xb] = auVar25[0xb] - auVar73[0xb];
        auVar23[0xc] = auVar25[0xc] - auVar73[0xc];
        auVar23._0_12_ = auVar17;
        auVar23[0xd] = auVar25[0xd] - auVar73[0xd];
        auVar30[0xe] = auVar25[0xe] - auVar73[0xe];
        auVar30._0_14_ = auVar23;
        auVar30[0xf] = auVar25[0xf] - auVar73[0xf];
        auVar25 = auVar30 & _DAT_001311d0;
        auVar31._0_2_ = uVar9 >> 2;
        auVar31._2_2_ = (ushort)((uint)uVar10 >> 0x12);
        auVar31._4_2_ = (ushort)((uint6)uVar11 >> 0x22);
        auVar31._6_2_ = (ushort)((ulong)uVar12 >> 0x32);
        auVar31._8_2_ = (ushort)((unkuint10)auVar17._0_10_ >> 0x42);
        auVar31._10_2_ = auVar17._10_2_ >> 2;
        auVar31._12_2_ = auVar23._12_2_ >> 2;
        auVar31._14_2_ = auVar30._14_2_ >> 2;
        auVar31 = auVar31 & _DAT_001311d0;
        cVar8 = auVar31[0] + auVar25[0];
        bVar33 = auVar31[1] + auVar25[1];
        uVar9 = CONCAT11(bVar33,cVar8);
        cVar34 = auVar31[2] + auVar25[2];
        bVar35 = auVar31[3] + auVar25[3];
        uVar10 = CONCAT13(bVar35,CONCAT12(cVar34,uVar9));
        cVar36 = auVar31[4] + auVar25[4];
        bVar37 = auVar31[5] + auVar25[5];
        uVar11 = CONCAT15(bVar37,CONCAT14(cVar36,uVar10));
        cVar38 = auVar31[6] + auVar25[6];
        bVar39 = auVar31[7] + auVar25[7];
        uVar12 = CONCAT17(bVar39,CONCAT16(cVar38,uVar11));
        cVar40 = auVar31[8] + auVar25[8];
        bVar41 = auVar31[9] + auVar25[9];
        auVar18._0_10_ = CONCAT19(bVar41,CONCAT18(cVar40,uVar12));
        auVar18[10] = auVar31[10] + auVar25[10];
        auVar18[0xb] = auVar31[0xb] + auVar25[0xb];
        auVar24[0xc] = auVar31[0xc] + auVar25[0xc];
        auVar24._0_12_ = auVar18;
        auVar24[0xd] = auVar31[0xd] + auVar25[0xd];
        auVar32[0xe] = auVar31[0xe] + auVar25[0xe];
        auVar32._0_14_ = auVar24;
        auVar32[0xf] = auVar31[0xf] + auVar25[0xf];
        auVar74[0] = ((char)(uVar9 >> 4) + cVar8 & 0xfU) + ((char)(uVar43 >> 4) + cVar42 & 0xfU);
        auVar74[1] = ((bVar33 >> 4) + bVar33 & 0xf) + ((bVar75 >> 4) + bVar75 & 0xf);
        auVar74[2] = ((char)(ushort)((uint)uVar10 >> 0x14) + cVar34 & 0xfU) +
                     ((char)(ushort)((uint)uVar44 >> 0x14) + cVar76 & 0xfU);
        auVar74[3] = ((bVar35 >> 4) + bVar35 & 0xf) + ((bVar77 >> 4) + bVar77 & 0xf);
        auVar74[4] = ((char)(ushort)((uint6)uVar11 >> 0x24) + cVar36 & 0xfU) +
                     ((char)(ushort)((uint6)uVar45 >> 0x24) + cVar78 & 0xfU);
        auVar74[5] = ((bVar37 >> 4) + bVar37 & 0xf) + ((bVar79 >> 4) + bVar79 & 0xf);
        auVar74[6] = ((char)(ushort)((ulong)uVar12 >> 0x34) + cVar38 & 0xfU) +
                     ((char)(ushort)((ulong)uVar46 >> 0x34) + cVar80 & 0xfU);
        auVar74[7] = ((bVar39 >> 4) + bVar39 & 0xf) + ((bVar81 >> 4) + bVar81 & 0xf);
        auVar74[8] = ((char)(ushort)((unkuint10)auVar18._0_10_ >> 0x44) + cVar40 & 0xfU) +
                     ((char)(ushort)((unkuint10)auVar52._0_10_ >> 0x44) + cVar82 & 0xfU);
        auVar74[9] = ((bVar41 >> 4) + bVar41 & 0xf) + ((bVar83 >> 4) + bVar83 & 0xf);
        auVar74[10] = ((char)(auVar18._10_2_ >> 4) + auVar18[10] & 0xfU) +
                      ((char)(auVar52._10_2_ >> 4) + auVar52[10] & 0xfU);
        auVar74[0xb] = ((auVar18[0xb] >> 4) + auVar18[0xb] & 0xf) +
                       ((auVar52[0xb] >> 4) + auVar52[0xb] & 0xf);
        auVar74[0xc] = ((char)(auVar24._12_2_ >> 4) + auVar24[0xc] & 0xfU) +
                       ((char)(auVar58._12_2_ >> 4) + auVar58[0xc] & 0xfU);
        auVar74[0xd] = ((auVar24[0xd] >> 4) + auVar24[0xd] & 0xf) +
                       ((auVar58[0xd] >> 4) + auVar58[0xd] & 0xf);
        auVar74[0xe] = ((char)(auVar32._14_2_ >> 4) + auVar32[0xe] & 0xfU) +
                       ((char)(auVar72._14_2_ >> 4) + auVar72[0xe] & 0xfU);
        auVar74[0xf] = ((auVar32[0xf] >> 4) + auVar32[0xf] & 0xf) +
                       ((auVar72[0xf] >> 4) + auVar72[0xf] & 0xf);
        auVar25 = psadbw(auVar74,(undefined1  [16])0x0);
        sVar1 = sVar1 + auVar25._8_8_ + auVar25._0_8_;
        uVar7 = uVar6 + 4;
        uVar4 = uVar6 + 7;
        uVar6 = uVar7;
      } while (uVar4 < uVar5);
    }
    if (uVar7 < uVar5) {
      do {
        uVar6 = b1->array[uVar7] - (b1->array[uVar7] >> 1 & 0x5555555555555555);
        uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
        sVar1 = sVar1 + (((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    }
  }
  return sVar1;
}

Assistant:

size_t bitset_union_count(const bitset_t *CBITSET_RESTRICT b1,
                          const bitset_t *CBITSET_RESTRICT b2) {
    size_t answer = 0;
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    size_t k = 0;
    for (; k + 3 < minlength; k += 4) {
        answer += roaring_hamming(b1->array[k] | b2->array[k]);
        answer += roaring_hamming(b1->array[k + 1] | b2->array[k + 1]);
        answer += roaring_hamming(b1->array[k + 2] | b2->array[k + 2]);
        answer += roaring_hamming(b1->array[k + 3] | b2->array[k + 3]);
    }
    for (; k < minlength; ++k) {
        answer += roaring_hamming(b1->array[k] | b2->array[k]);
    }
    if (b2->arraysize > b1->arraysize) {
        // k is equal to b1->arraysize
        for (; k + 3 < b2->arraysize; k += 4) {
            answer += roaring_hamming(b2->array[k]);
            answer += roaring_hamming(b2->array[k + 1]);
            answer += roaring_hamming(b2->array[k + 2]);
            answer += roaring_hamming(b2->array[k + 3]);
        }
        for (; k < b2->arraysize; ++k) {
            answer += roaring_hamming(b2->array[k]);
        }
    } else {
        // k is equal to b2->arraysize
        for (; k + 3 < b1->arraysize; k += 4) {
            answer += roaring_hamming(b1->array[k]);
            answer += roaring_hamming(b1->array[k + 1]);
            answer += roaring_hamming(b1->array[k + 2]);
            answer += roaring_hamming(b1->array[k + 3]);
        }
        for (; k < b1->arraysize; ++k) {
            answer += roaring_hamming(b1->array[k]);
        }
    }
    return answer;
}